

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::fillPriorityQueue(SimpleToMonotone *this)

{
  long lVar1;
  int *__first;
  ulong uVar2;
  long lVar3;
  
  (this->m_upperVertex).siz = 0;
  QDataBuffer<int>::reserve(&this->m_upperVertex,(this->m_edges).siz);
  uVar2 = (this->m_upperVertex).siz;
  if (0 < (this->m_edges).siz) {
    lVar3 = 0;
    do {
      QDataBuffer<int>::reserve(&this->m_upperVertex,uVar2 + 1);
      lVar1 = (this->m_upperVertex).siz;
      (this->m_upperVertex).buffer[lVar1] = (int)lVar3;
      uVar2 = lVar1 + 1;
      (this->m_upperVertex).siz = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->m_edges).siz);
  }
  if (uVar2 != 0) {
    __first = (this->m_upperVertex).buffer;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>>
              (__first,__first + uVar2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>)this
              );
    std::
    __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>>
              (__first,__first + uVar2,
               (_Iter_comp_iter<QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>)this
              );
    return;
  }
  return;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::fillPriorityQueue()
{
    m_upperVertex.reset();
    m_upperVertex.reserve(m_edges.size());
    for (int i = 0; i < m_edges.size(); ++i)
        m_upperVertex.add(i);
    CompareVertices cmp(this);
    std::sort(m_upperVertex.data(), m_upperVertex.data() + m_upperVertex.size(), cmp);
    //for (int i = 1; i < m_upperVertex.size(); ++i) {
    //    Q_ASSERT(!cmp(m_upperVertex.at(i), m_upperVertex.at(i - 1)));
    //}
}